

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

optional<bool> __thiscall
wallet::CWallet::IsInternalScriptPubKeyMan(CWallet *this,ScriptPubKeyMan *spk_man)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  size_type sVar4;
  DescriptorScriptPubKeyMan *this_00;
  uint extraout_var;
  DescriptorScriptPubKeyMan *pDVar5;
  runtime_error *this_01;
  ushort uVar6;
  long in_FS_OFFSET;
  ScriptPubKeyMan *spk_man_local;
  undefined8 local_140;
  WalletDescriptor local_138;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock67;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  spk_man_local = spk_man;
  if (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0) {
LAB_004688e1:
    uVar6 = 0;
    uVar2 = 0;
  }
  else {
    GetActiveScriptPubKeyMans
              ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                *)&local_138,this);
    sVar4 = std::
            set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
            ::count((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                     *)&local_138,&spk_man_local);
    std::
    _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
    ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                 *)&local_138);
    if (sVar4 == 0) goto LAB_004688e1;
    if (spk_man_local == (ScriptPubKeyMan *)0x0) {
LAB_00468912:
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&criticalblock67,"IsInternalScriptPubKeyMan",
                 (allocator<char> *)&local_140);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &criticalblock67,": unexpected ScriptPubKeyMan type.");
      std::runtime_error::runtime_error(this_01,(string *)&local_138);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00468a4a;
    }
    this_00 = (DescriptorScriptPubKeyMan *)
              __dynamic_cast(spk_man_local,&ScriptPubKeyMan::typeinfo,
                             &DescriptorScriptPubKeyMan::typeinfo,0);
    if (this_00 == (DescriptorScriptPubKeyMan *)0x0) goto LAB_00468912;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock67,&this_00->cs_desc_man,"desc_spk_man->cs_desc_man",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
               ,0xf33,false);
    DescriptorScriptPubKeyMan::GetWalletDescriptor(&local_138,this_00);
    iVar3 = (*(local_138.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_Descriptor[0xb])();
    local_140 = CONCAT44(extraout_var,iVar3);
    WalletDescriptor::~WalletDescriptor(&local_138);
    if ((extraout_var & 1) == 0) {
      __assert_fail("type.has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0xf35,
                    "std::optional<bool> wallet::CWallet::IsInternalScriptPubKeyMan(ScriptPubKeyMan *) const"
                   );
    }
    pDVar5 = (DescriptorScriptPubKeyMan *)GetScriptPubKeyMan(this,(OutputType *)&local_140,true);
    uVar6 = (ushort)(pDVar5 == this_00);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock67.super_unique_lock);
    uVar2 = 0x100;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar2 | uVar6);
  }
LAB_00468a4a:
  __stack_chk_fail();
}

Assistant:

std::optional<bool> CWallet::IsInternalScriptPubKeyMan(ScriptPubKeyMan* spk_man) const
{
    // Legacy script pubkey man can't be either external or internal
    if (IsLegacy()) {
        return std::nullopt;
    }

    // only active ScriptPubKeyMan can be internal
    if (!GetActiveScriptPubKeyMans().count(spk_man)) {
        return std::nullopt;
    }

    const auto desc_spk_man = dynamic_cast<DescriptorScriptPubKeyMan*>(spk_man);
    if (!desc_spk_man) {
        throw std::runtime_error(std::string(__func__) + ": unexpected ScriptPubKeyMan type.");
    }

    LOCK(desc_spk_man->cs_desc_man);
    const auto& type = desc_spk_man->GetWalletDescriptor().descriptor->GetOutputType();
    assert(type.has_value());

    return GetScriptPubKeyMan(*type, /* internal= */ true) == desc_spk_man;
}